

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

string * join(string *__return_storage_ptr__,string *separator,
             vector<int,_std::allocator<int>_> *items)

{
  pointer piVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  stringstream s;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  piVar1 = (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)((long)piVar1 - (long)piVar2 >> 2);
      uVar3 = uVar3 + 1) {
    if (uVar4 != 0) {
      std::operator<<(local_1a8,(string *)separator);
    }
    std::ostream::operator<<
              (local_1a8,
               (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string join (
  const std::string& separator,
  const std::vector<int>& items)
{
  std::stringstream s;
  auto size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    if (i)
      s << separator;

    s << items[i];
  }

  return s.str ();
}